

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O1

void __thiscall QThreadPoolPrivate::clear(QThreadPoolPrivate *this)

{
  QMutex *this_00;
  qsizetype *pqVar1;
  __pointer_type pQVar2;
  QueuePage *this_01;
  iterator iVar3;
  QRunnable *pQVar4;
  bool bVar5;
  
  this_00 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar5 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar5) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar5) goto LAB_003d3e41;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_003d3e41:
  if ((this->queue).d.size != 0) {
    do {
      iVar3 = QList<QueuePage_*>::end(&this->queue);
      this_01 = iVar3.i[-1];
      pqVar1 = &(this->queue).d.size;
      *pqVar1 = *pqVar1 + -1;
LAB_003d3e6e:
      if (this_01->m_firstIndex <= this_01->m_lastIndex) {
        pQVar4 = QueuePage::pop(this_01);
        if ((pQVar4 != (QRunnable *)0x0) && (pQVar4->m_autoDelete == true)) {
          LOCK();
          pQVar2 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
          (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
          UNLOCK();
          if (pQVar2 != (__pointer_type)0x1) {
            QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,pQVar2);
          }
          (*pQVar4->_vptr_QRunnable[2])(pQVar4);
          if ((this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
            LOCK();
            bVar5 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
            if (bVar5) {
              (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
            }
            UNLOCK();
            if (bVar5) goto LAB_003d3e6e;
          }
          QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
        }
        goto LAB_003d3e6e;
      }
      operator_delete(this_01,0x810);
    } while ((this->queue).d.size != 0);
  }
  LOCK();
  pQVar2 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar2 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,pQVar2);
    return;
  }
  return;
}

Assistant:

void QThreadPoolPrivate::clear()
{
    QMutexLocker locker(&mutex);
    while (!queue.isEmpty()) {
        auto *page = queue.takeLast();
        while (!page->isFinished()) {
            QRunnable *r = page->pop();
            if (r && r->autoDelete()) {
                locker.unlock();
                delete r;
                locker.relock();
            }
        }
        delete page;
    }
}